

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3CreateTables(Fts3Table *p)

{
  sqlite3 *db_00;
  char *pcVar1;
  bool bVar2;
  char *z;
  char *zContentCols;
  char *zLanguageid;
  sqlite3 *db;
  int i;
  int rc;
  Fts3Table *p_local;
  
  db._4_4_ = 0;
  db_00 = p->db;
  _i = p;
  if (p->zContentTbl == (char *)0x0) {
    pcVar1 = p->zLanguageid;
    z = sqlite3_mprintf("docid INTEGER PRIMARY KEY");
    db._0_4_ = 0;
    while( true ) {
      bVar2 = false;
      if (z != (char *)0x0) {
        bVar2 = (int)(uint)db < _i->nColumn;
      }
      if (!bVar2) break;
      z = sqlite3_mprintf("%z, \'c%d%q\'",z,(ulong)(uint)db,_i->azColumn[(int)(uint)db]);
      db._0_4_ = (uint)db + 1;
    }
    if ((pcVar1 != (char *)0x0) && (z != (char *)0x0)) {
      z = sqlite3_mprintf("%z, langid",z,pcVar1);
    }
    if (z == (char *)0x0) {
      db._4_4_ = 7;
    }
    fts3DbExec((int *)((long)&db + 4),db_00,"CREATE TABLE %Q.\'%q_content\'(%s)",_i->zDb,_i->zName,z
              );
    sqlite3_free(z);
  }
  fts3DbExec((int *)((long)&db + 4),db_00,
             "CREATE TABLE %Q.\'%q_segments\'(blockid INTEGER PRIMARY KEY, block BLOB);",_i->zDb,
             _i->zName);
  fts3DbExec((int *)((long)&db + 4),db_00,
             "CREATE TABLE %Q.\'%q_segdir\'(level INTEGER,idx INTEGER,start_block INTEGER,leaves_end_block INTEGER,end_block INTEGER,root BLOB,PRIMARY KEY(level, idx));"
             ,_i->zDb,_i->zName);
  if (_i->bHasDocsize != '\0') {
    fts3DbExec((int *)((long)&db + 4),db_00,
               "CREATE TABLE %Q.\'%q_docsize\'(docid INTEGER PRIMARY KEY, size BLOB);",_i->zDb,
               _i->zName);
  }
  if (_i->bHasStat != '\0') {
    sqlite3Fts3CreateStatTable((int *)((long)&db + 4),_i);
  }
  return db._4_4_;
}

Assistant:

static int fts3CreateTables(Fts3Table *p){
  int rc = SQLITE_OK;             /* Return code */
  int i;                          /* Iterator variable */
  sqlite3 *db = p->db;            /* The database connection */

  if( p->zContentTbl==0 ){
    const char *zLanguageid = p->zLanguageid;
    char *zContentCols;           /* Columns of %_content table */

    /* Create a list of user columns for the content table */
    zContentCols = sqlite3_mprintf("docid INTEGER PRIMARY KEY");
    for(i=0; zContentCols && i<p->nColumn; i++){
      char *z = p->azColumn[i];
      zContentCols = sqlite3_mprintf("%z, 'c%d%q'", zContentCols, i, z);
    }
    if( zLanguageid && zContentCols ){
      zContentCols = sqlite3_mprintf("%z, langid", zContentCols, zLanguageid);
    }
    if( zContentCols==0 ) rc = SQLITE_NOMEM;
  
    /* Create the content table */
    fts3DbExec(&rc, db, 
       "CREATE TABLE %Q.'%q_content'(%s)",
       p->zDb, p->zName, zContentCols
    );
    sqlite3_free(zContentCols);
  }

  /* Create other tables */
  fts3DbExec(&rc, db, 
      "CREATE TABLE %Q.'%q_segments'(blockid INTEGER PRIMARY KEY, block BLOB);",
      p->zDb, p->zName
  );
  fts3DbExec(&rc, db, 
      "CREATE TABLE %Q.'%q_segdir'("
        "level INTEGER,"
        "idx INTEGER,"
        "start_block INTEGER,"
        "leaves_end_block INTEGER,"
        "end_block INTEGER,"
        "root BLOB,"
        "PRIMARY KEY(level, idx)"
      ");",
      p->zDb, p->zName
  );
  if( p->bHasDocsize ){
    fts3DbExec(&rc, db, 
        "CREATE TABLE %Q.'%q_docsize'(docid INTEGER PRIMARY KEY, size BLOB);",
        p->zDb, p->zName
    );
  }
  assert( p->bHasStat==p->bFts4 );
  if( p->bHasStat ){
    sqlite3Fts3CreateStatTable(&rc, p);
  }
  return rc;
}